

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ssh_key * ecdsa_new_priv_openssh(ssh_keyalg *alg,BinarySource *src)

{
  ec_curve *curve_00;
  undefined8 *puVar1;
  WeierstrassPoint *pWVar2;
  mp_int *pmVar3;
  ecdsa_key *ek;
  ec_curve *curve;
  ecsign_extra *extra;
  BinarySource *src_local;
  ssh_keyalg *alg_local;
  
  curve_00 = (ec_curve *)(**alg->extra)();
  if (curve_00->type == EC_WEIERSTRASS) {
    BinarySource_get_string(src->binarysource_);
    puVar1 = (undefined8 *)safemalloc(1,0x20,0);
    puVar1[3] = alg;
    *puVar1 = curve_00;
    puVar1[2] = 0;
    pWVar2 = BinarySource_get_wpoint(src->binarysource_,curve_00);
    puVar1[1] = pWVar2;
    if (puVar1[1] == 0) {
      ecdsa_freekey((ssh_key *)(puVar1 + 3));
      alg_local = (ssh_keyalg *)0x0;
    }
    else {
      pmVar3 = BinarySource_get_mp_ssh2(src->binarysource_);
      puVar1[2] = pmVar3;
      alg_local = (ssh_keyalg *)(puVar1 + 3);
    }
    return (ssh_key *)alg_local;
  }
  __assert_fail("curve->type == EC_WEIERSTRASS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x399,"ssh_key *ecdsa_new_priv_openssh(const ssh_keyalg *, BinarySource *)");
}

Assistant:

static ssh_key *ecdsa_new_priv_openssh(
    const ssh_keyalg *alg, BinarySource *src)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_WEIERSTRASS);

    get_string(src);

    struct ecdsa_key *ek = snew(struct ecdsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = get_wpoint(src, curve);
    if (!ek->publicKey) {
        ecdsa_freekey(&ek->sshk);
        return NULL;
    }

    ek->privateKey = get_mp_ssh2(src);

    return &ek->sshk;
}